

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O1

uv_signal_t * uv__signal_first_handle(int signum)

{
  uv__signal_tree_s uVar1;
  int iVar2;
  long lVar3;
  uv_signal_t *puVar4;
  uv_signal_t *w2;
  uv_signal_t lookup;
  uv_signal_t local_c0;
  
  local_c0.flags = 0;
  local_c0.loop = (uv_loop_t *)0x0;
  puVar4 = (uv_signal_t *)0x0;
  w2 = puVar4;
  if (uv__signal_tree.rbh_root != (uv_signal_s *)0x0) {
    uVar1.rbh_root = uv__signal_tree.rbh_root;
    local_c0.signum = signum;
    do {
      w2 = uVar1.rbh_root;
      iVar2 = uv__signal_compare(&local_c0,w2);
      if (iVar2 < 0) {
        lVar3 = 0x78;
        puVar4 = w2;
      }
      else {
        lVar3 = 0x80;
        if (iVar2 == 0) break;
      }
      uVar1.rbh_root = *(uv_signal_s **)((long)w2->handle_queue + lVar3 + -0x28);
      w2 = puVar4;
    } while (uVar1.rbh_root != (uv_signal_t *)0x0);
  }
  if ((w2 == (uv_signal_t *)0x0) || (w2->signum != signum)) {
    w2 = (uv_signal_t *)0x0;
  }
  return w2;
}

Assistant:

static uv_signal_t* uv__signal_first_handle(int signum) {
  /* This function must be called with the signal lock held. */
  uv_signal_t lookup;
  uv_signal_t* handle;

  lookup.signum = signum;
  lookup.flags = 0;
  lookup.loop = NULL;

  handle = RB_NFIND(uv__signal_tree_s, &uv__signal_tree, &lookup);

  if (handle != NULL && handle->signum == signum)
    return handle;

  return NULL;
}